

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O2

void __thiscall
UIContext::UIContext
          (UIContext *this,GraphicsContext *context,string *window_name,int width,int height)

{
  Detail *this_00;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this->_vptr_UIContext = (_func_int **)&PTR___cxa_pure_virtual_001db3e0;
  this_00 = (Detail *)operator_new(0x50);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(ApplicationContextBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter1.cpp:523:30)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(ApplicationContextBase_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter1.cpp:523:30)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  Detail::Detail(this_00,context,(function<void_(ApplicationContextBase_&)> *)&local_50,window_name,
                 width,height);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  this->m_ = this_00;
  return;
}

Assistant:

UIContext::UIContext(GraphicsContext& context,
    const std::string& window_name, int width, int height)
    : m_(new Detail(context, [this](ApplicationContextBase& ac) { Run(ac); }, window_name, width, height))
{
}